

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void raviH_set_int(lua_State *L,RaviArray *t,lua_Unsigned u1,lua_Integer value)

{
  int iVar1;
  char *fmt;
  uint uVar2;
  
  if ((t->flags & 8) != 0) {
    __assert_fail("(t->flags & RAVI_ARRAY_ISFLOAT) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                  ,0x35d,"void raviH_set_int(lua_State *, RaviArray *, lua_Unsigned, lua_Integer)");
  }
  uVar2 = (uint)u1;
  if (t->len <= uVar2) {
    if (t->len != uVar2) {
      fmt = "array out of bounds";
LAB_0011fc1b:
      luaG_runerror(L,fmt);
    }
    if (t->size <= uVar2) {
      iVar1 = ravi_resize_array(L,t,0,1);
      if (iVar1 == 0) {
        fmt = "array cannot be resized";
        goto LAB_0011fc1b;
      }
      uVar2 = t->len;
    }
    t->len = uVar2 + 1;
  }
  *(lua_Integer *)(t->data + (u1 & 0xffffffff) * 8) = value;
  return;
}

Assistant:

void raviH_set_int(lua_State *L, RaviArray *t, lua_Unsigned u1, lua_Integer value) {
  unsigned int u = (unsigned int)u1;
  lua_assert((t->flags & RAVI_ARRAY_ISFLOAT) == 0);
  lua_Integer *data;
  if (u < t->len) {
  setval2:
    data = (lua_Integer *)t->data;
    data[u] = value;
  } else if (u == t->len) {
    if (u < t->size) {
    setval:
      t->len++;
      goto setval2;
    } else {
      if (ravi_resize_array(L, t, 0, 1))
        goto setval;
      else
        luaG_runerror(L, "array cannot be resized");
    }
  } else
    luaG_runerror(L, "array out of bounds");
}